

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

void __thiscall PSBTInput::FillSignatureData(PSBTInput *this,SignatureData *sigdata)

{
  _Base_ptr __args;
  uint256 *puVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  _Base_ptr p_Var10;
  uchar *puVar11;
  uint uVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__args_1;
  allocator_type *paVar13;
  _Rb_tree_header *p_Var14;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  uint160 result;
  uint160 local_c8;
  CSHA256 local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (this->final_script_sig).super_CScriptBase._size;
  uVar12 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar12 = uVar2;
  }
  if (uVar12 != 0) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(sigdata->scriptSig).super_CScriptBase,&(this->final_script_sig).super_CScriptBase);
    sigdata->complete = true;
  }
  if ((this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator=(&(sigdata->scriptWitness).stack,&(this->final_script_witness).stack);
    sigdata->complete = true;
  }
  if (sigdata->complete == false) {
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
    ::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                *)&sigdata->signatures,
               (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                )&(this->partial_sigs)._M_t._M_impl.super__Rb_tree_header);
    uVar2 = (this->redeem_script).super_CScriptBase._size;
    uVar12 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar12 = uVar2;
    }
    if (uVar12 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(sigdata->redeem_script).super_CScriptBase,
                 &(this->redeem_script).super_CScriptBase);
    }
    uVar2 = (this->witness_script).super_CScriptBase._size;
    uVar12 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar12 = uVar2;
    }
    __args_1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)uVar12;
    if (uVar12 != 0) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&(sigdata->witness_script).super_CScriptBase,
                 &(this->witness_script).super_CScriptBase);
    }
    p_Var10 = (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var14) {
      do {
        CPubKey::GetID((CKeyID *)&local_a8,(CPubKey *)(p_Var10 + 1));
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
        ::_M_emplace_unique<CKeyID,std::pair<CPubKey_const,KeyOriginInfo>const&>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                    *)&sigdata->misc_pubkeys,(CKeyID *)&local_a8,
                   (pair<const_CPubKey,_KeyOriginInfo> *)(p_Var10 + 1));
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    }
    if ((this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&sigdata->taproot_key_path_sig,&this->m_tap_key_sig);
    }
    p_Var10 = (this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var14) {
      do {
        std::
        _Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::pair<XOnlyPubKey,uint256>const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->taproot_script_sigs,
                   (_Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)(p_Var10 + 1),(pair<XOnlyPubKey,_uint256> *)(p_Var10 + 3),__args_1);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    }
    puVar1 = &this->m_tap_merkle_root;
    puVar11 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (&this->m_tap_internal_key,puVar1);
    if ((uint256 *)puVar11 != puVar1) {
      uVar3 = *(undefined4 *)
               (this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems;
      uVar4 = *(undefined4 *)
               ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 4);
      uVar5 = *(undefined4 *)
               ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8);
      uVar6 = *(undefined4 *)
               ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0xc);
      uVar7 = *(undefined8 *)
               ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10)
           = *(undefined8 *)
              ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18)
           = uVar7;
      *(undefined4 *)
       (sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems = uVar3;
      *(undefined4 *)
       ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 4) =
           uVar4;
      *(undefined4 *)
       ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
           uVar5;
      *(undefined4 *)
       ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 0xc)
           = uVar6;
    }
    puVar11 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (puVar1,&this->unknown);
    if ((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)puVar11 != &this->unknown) {
      uVar7 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      uVar8 = *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 8);
      uVar9 = *(undefined8 *)
               ((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       ((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       ((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar9;
      *(undefined8 *)(sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems =
           uVar7;
      *(undefined8 *)((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 8)
           = uVar8;
    }
    p_Var10 = (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var14) {
      do {
        std::
        _Rb_tree<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Select1st<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
        ::
        _M_emplace_unique<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const&,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>const&>
                  ((_Rb_tree<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Select1st<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                    *)&(sigdata->tr_spenddata).scripts,
                   (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                   (p_Var10 + 1),
                   (set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)(p_Var10 + 2));
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    }
    p_Var10 = (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var14) {
      do {
        __args = p_Var10 + 1;
        std::
        _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
        ::
        _M_emplace_unique<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
                  ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                    *)&sigdata->taproot_misc_pubkeys,(XOnlyPubKey *)__args,
                   (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                    *)(p_Var10 + 2));
        local_c8.super_base_blob<160U>.m_data._M_elems[0] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[4] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[5] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[6] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[7] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[8] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[9] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[10] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
        local_c8.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
        local_a8.buf[0x30] = '\0';
        local_a8.buf[0x31] = '\0';
        local_a8.buf[0x32] = '\0';
        local_a8.buf[0x33] = '\0';
        local_a8.buf[0x34] = '\0';
        local_a8.buf[0x35] = '\0';
        local_a8.buf[0x36] = '\0';
        local_a8.buf[0x37] = '\0';
        local_a8.buf[0x38] = '\0';
        local_a8.buf[0x39] = '\0';
        local_a8.buf[0x3a] = '\0';
        local_a8.buf[0x3b] = '\0';
        local_a8.buf[0x3c] = '\0';
        local_a8.buf[0x3d] = '\0';
        local_a8.buf[0x3e] = '\0';
        local_a8.buf[0x3f] = '\0';
        local_a8.buf[0x20] = '\0';
        local_a8.buf[0x21] = '\0';
        local_a8.buf[0x22] = '\0';
        local_a8.buf[0x23] = '\0';
        local_a8.buf[0x24] = '\0';
        local_a8.buf[0x25] = '\0';
        local_a8.buf[0x26] = '\0';
        local_a8.buf[0x27] = '\0';
        local_a8.buf[0x28] = '\0';
        local_a8.buf[0x29] = '\0';
        local_a8.buf[0x2a] = '\0';
        local_a8.buf[0x2b] = '\0';
        local_a8.buf[0x2c] = '\0';
        local_a8.buf[0x2d] = '\0';
        local_a8.buf[0x2e] = '\0';
        local_a8.buf[0x2f] = '\0';
        local_a8.buf[0x10] = '\0';
        local_a8.buf[0x11] = '\0';
        local_a8.buf[0x12] = '\0';
        local_a8.buf[0x13] = '\0';
        local_a8.buf[0x14] = '\0';
        local_a8.buf[0x15] = '\0';
        local_a8.buf[0x16] = '\0';
        local_a8.buf[0x17] = '\0';
        local_a8.buf[0x18] = '\0';
        local_a8.buf[0x19] = '\0';
        local_a8.buf[0x1a] = '\0';
        local_a8.buf[0x1b] = '\0';
        local_a8.buf[0x1c] = '\0';
        local_a8.buf[0x1d] = '\0';
        local_a8.buf[0x1e] = '\0';
        local_a8.buf[0x1f] = '\0';
        local_a8.buf[0] = '\0';
        local_a8.buf[1] = '\0';
        local_a8.buf[2] = '\0';
        local_a8.buf[3] = '\0';
        local_a8.buf[4] = '\0';
        local_a8.buf[5] = '\0';
        local_a8.buf[6] = '\0';
        local_a8.buf[7] = '\0';
        local_a8.buf[8] = '\0';
        local_a8.buf[9] = '\0';
        local_a8.buf[10] = '\0';
        local_a8.buf[0xb] = '\0';
        local_a8.buf[0xc] = '\0';
        local_a8.buf[0xd] = '\0';
        local_a8.buf[0xe] = '\0';
        local_a8.buf[0xf] = '\0';
        local_a8.s[4] = 0;
        local_a8.s[5] = 0;
        local_a8.s[6] = 0;
        local_a8.s[7] = 0;
        local_a8.s._0_8_ = (void *)0x0;
        local_a8.s[2] = 0;
        local_a8.s[3] = 0;
        local_a8.bytes = 0;
        CSHA256::CSHA256(&local_a8);
        CSHA256::Write(&local_a8,(uchar *)__args,0x20);
        output.m_size = 0x14;
        output.m_data = (uchar *)&local_c8;
        CHash160::Finalize((CHash160 *)&local_a8,output);
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,XOnlyPubKey>,std::_Select1st<std::pair<CKeyID_const,XOnlyPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>
        ::_M_emplace_unique<uint160,XOnlyPubKey_const&>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,XOnlyPubKey>,std::_Select1st<std::pair<CKeyID_const,XOnlyPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>
                    *)&sigdata->tap_pubkeys,&local_c8,(XOnlyPubKey *)__args);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    }
    p_Var10 = (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var14) {
      do {
        paVar13 = (allocator_type *)&local_c8;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                   (uchar *)(p_Var10 + 1),(uchar *)((long)&p_Var10[1]._M_left + 4),
                   (allocator_type *)&local_c8);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->ripemd160_preimages,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_a8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var10[1]._M_right,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar13);
        if ((void *)local_a8.s._0_8_ != (void *)0x0) {
          operator_delete((void *)local_a8.s._0_8_,local_a8.s._16_8_ - local_a8.s._0_8_);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    }
    p_Var10 = (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var14) {
      do {
        paVar13 = (allocator_type *)&local_c8;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                   (uchar *)(p_Var10 + 1),(uchar *)(p_Var10 + 2),(allocator_type *)&local_c8);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->sha256_preimages,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_a8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var10 + 2),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar13);
        if ((void *)local_a8.s._0_8_ != (void *)0x0) {
          operator_delete((void *)local_a8.s._0_8_,local_a8.s._16_8_ - local_a8.s._0_8_);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    }
    p_Var10 = (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var14) {
      do {
        paVar13 = (allocator_type *)&local_c8;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                   (uchar *)(p_Var10 + 1),(uchar *)((long)&p_Var10[1]._M_left + 4),
                   (allocator_type *)&local_c8);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->hash160_preimages,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_a8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var10[1]._M_right,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar13);
        if ((void *)local_a8.s._0_8_ != (void *)0x0) {
          operator_delete((void *)local_a8.s._0_8_,local_a8.s._16_8_ - local_a8.s._0_8_);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    }
    p_Var10 = (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var14) {
      do {
        paVar13 = (allocator_type *)&local_c8;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                   (uchar *)(p_Var10 + 1),(uchar *)(p_Var10 + 2),(allocator_type *)&local_c8);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->hash256_preimages,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_a8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var10 + 2),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar13);
        if ((void *)local_a8.s._0_8_ != (void *)0x0) {
          operator_delete((void *)local_a8.s._0_8_,local_a8.s._16_8_ - local_a8.s._0_8_);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var14);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PSBTInput::FillSignatureData(SignatureData& sigdata) const
{
    if (!final_script_sig.empty()) {
        sigdata.scriptSig = final_script_sig;
        sigdata.complete = true;
    }
    if (!final_script_witness.IsNull()) {
        sigdata.scriptWitness = final_script_witness;
        sigdata.complete = true;
    }
    if (sigdata.complete) {
        return;
    }

    sigdata.signatures.insert(partial_sigs.begin(), partial_sigs.end());
    if (!redeem_script.empty()) {
        sigdata.redeem_script = redeem_script;
    }
    if (!witness_script.empty()) {
        sigdata.witness_script = witness_script;
    }
    for (const auto& key_pair : hd_keypaths) {
        sigdata.misc_pubkeys.emplace(key_pair.first.GetID(), key_pair);
    }
    if (!m_tap_key_sig.empty()) {
        sigdata.taproot_key_path_sig = m_tap_key_sig;
    }
    for (const auto& [pubkey_leaf, sig] : m_tap_script_sigs) {
        sigdata.taproot_script_sigs.emplace(pubkey_leaf, sig);
    }
    if (!m_tap_internal_key.IsNull()) {
        sigdata.tr_spenddata.internal_key = m_tap_internal_key;
    }
    if (!m_tap_merkle_root.IsNull()) {
        sigdata.tr_spenddata.merkle_root = m_tap_merkle_root;
    }
    for (const auto& [leaf_script, control_block] : m_tap_scripts) {
        sigdata.tr_spenddata.scripts.emplace(leaf_script, control_block);
    }
    for (const auto& [pubkey, leaf_origin] : m_tap_bip32_paths) {
        sigdata.taproot_misc_pubkeys.emplace(pubkey, leaf_origin);
        sigdata.tap_pubkeys.emplace(Hash160(pubkey), pubkey);
    }
    for (const auto& [hash, preimage] : ripemd160_preimages) {
        sigdata.ripemd160_preimages.emplace(std::vector<unsigned char>(hash.begin(), hash.end()), preimage);
    }
    for (const auto& [hash, preimage] : sha256_preimages) {
        sigdata.sha256_preimages.emplace(std::vector<unsigned char>(hash.begin(), hash.end()), preimage);
    }
    for (const auto& [hash, preimage] : hash160_preimages) {
        sigdata.hash160_preimages.emplace(std::vector<unsigned char>(hash.begin(), hash.end()), preimage);
    }
    for (const auto& [hash, preimage] : hash256_preimages) {
        sigdata.hash256_preimages.emplace(std::vector<unsigned char>(hash.begin(), hash.end()), preimage);
    }
}